

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::egl::ChooseConfigRandomCase::iterate(ChooseConfigRandomCase *this)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  size_t sVar3;
  deUint32 dVar4;
  Random rnd;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> attributes;
  deRandom local_1b0;
  undefined1 local_1a0 [16];
  pointer local_190;
  ios_base local_128 [264];
  
  local_1a0._0_8_ =
       ((this->super_ChooseConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Iteration :",0xb);
  std::ostream::operator<<(this_00,this->m_iterNdx);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_128);
  dVar4 = this->m_iterNdx + 1;
  this->m_iterNdx = dVar4;
  deRandom_init(&local_1b0,dVar4);
  sVar3 = (this->m_attribSet)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  dVar4 = deRandom_getUint32(&local_1b0);
  genRandomAttributes((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                       *)local_1a0,this,&this->m_attribSet,dVar4 % ((int)sVar3 * 2 + 1U),
                      (Random *)&local_1b0);
  ChooseConfigCase::fillDontCare
            (&this->super_ChooseConfigCase,
             (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )local_1a0);
  ChooseConfigCase::executeTest
            (&this->super_ChooseConfigCase,
             (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )local_1a0,(this->super_ChooseConfigCase).m_checkOrder);
  iVar1 = this->m_numIters;
  iVar2 = this->m_iterNdx;
  if ((pointer)local_1a0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a0._0_8_,(long)local_190 - local_1a0._0_8_);
  }
  return (IterateResult)(iVar2 < iVar1);
}

Assistant:

TestCase::IterateResult iterate (void)
	{
		m_testCtx.getLog() << TestLog::Message << "Iteration :" << m_iterNdx << TestLog::EndMessage;
		m_iterNdx += 1;

		// Build random list of attributes
		de::Random									rnd(m_iterNdx);
		const int									numAttribs	= rnd.getInt(0, (int)m_attribSet.size()*2);

		std::vector<std::pair<EGLenum, EGLint> >	attributes	= genRandomAttributes(m_attribSet, numAttribs, rnd);

		fillDontCare(attributes);
		executeTest(attributes, m_checkOrder);

		return m_iterNdx < m_numIters ? CONTINUE : STOP;
	}